

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

vector<DataElement,_std::allocator<DataElement>_> * __thiscall
Client::ReceiveDataVector
          (vector<DataElement,_std::allocator<DataElement>_> *__return_storage_ptr__,Client *this)

{
  int __fd;
  ssize_t sVar1;
  size_type __n;
  reference __buf;
  int local_30;
  int i;
  allocator<DataElement> local_1e;
  undefined1 local_1d;
  int local_1c;
  Client *pCStack_18;
  int size;
  Client *this_local;
  vector<DataElement,_std::allocator<DataElement>_> *V;
  
  pCStack_18 = this;
  this_local = (Client *)__return_storage_ptr__;
  sVar1 = recv(this->sockfd,&local_1c,4,0);
  this->n = (int)sVar1;
  if (this->n < 0) {
    printf("ERROR in Client reading from socket!\n");
  }
  local_1d = 0;
  __n = (size_type)local_1c;
  std::allocator<DataElement>::allocator(&local_1e);
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            (__return_storage_ptr__,__n,&local_1e);
  std::allocator<DataElement>::~allocator(&local_1e);
  for (local_30 = 0; local_30 < local_1c; local_30 = local_30 + 1) {
    __fd = this->sockfd;
    __buf = std::vector<DataElement,_std::allocator<DataElement>_>::operator[]
                      (__return_storage_ptr__,(long)local_30);
    sVar1 = recv(__fd,__buf,0x10,0);
    this->n = (int)sVar1;
    if (this->n < 0) {
      printf("ERROR in Client reading from socket!\n");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<DataElement> Client::ReceiveDataVector()
{
    int size;
    n = recv(sockfd, &size, sizeof(size), 0);
    if (n < 0)
        printf("ERROR in Client reading from socket!\n");
 
    std::vector<DataElement> V(size);
    for (int i = 0; i < size; i++)
    {
        n = recv(sockfd, &V[i], sizeof(V[i]), 0);
        if (n < 0)
            printf("ERROR in Client reading from socket!\n");
    }
    return V;
}